

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::benchmarkStarting(ConsoleReporter *this,BenchmarkInfo *info)

{
  TablePrinter *pTVar1;
  bool bVar2;
  bool bVar3;
  Column nameCol;
  iterator __begin1;
  string line;
  iterator __end1;
  Column local_e0;
  iterator local_b0;
  string local_80;
  iterator local_60;
  
  lazyPrintWithoutClosingBenchmarkTable(this);
  clara::TextFlow::Column::Column((Column *)&local_b0,&info->name);
  local_b0.m_len =
       (long)*(int *)(*(long *)&(((this->m_tablePrinter)._M_t.
                                  super___uniq_ptr_impl<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Catch::TablePrinter_*,_std::default_delete<Catch::TablePrinter>_>
                                  .super__Head_base<0UL,_Catch::TablePrinter_*,_false>._M_head_impl)
                                ->m_columnInfos).
                                super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
                                ._M_impl + 0x20) - 2;
  clara::TextFlow::Column::Column(&local_e0,(Column *)&local_b0);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_b0);
  clara::TextFlow::Column::iterator::iterator(&local_b0,&local_e0);
  local_60.m_stringIndex =
       (long)local_e0.m_strings.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)local_e0.m_strings.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5;
  local_60.m_pos = 0;
  local_60.m_len._0_1_ = 0;
  local_60.m_len._1_7_ = 0;
  local_60.m_end._0_1_ = 0;
  local_60._33_8_ = 0;
  bVar3 = true;
  local_60.m_column = &local_e0;
  while( true ) {
    bVar2 = clara::TextFlow::Column::iterator::operator!=(&local_b0,&local_60);
    if (!bVar2) break;
    clara::TextFlow::Column::iterator::operator*[abi_cxx11_(&local_80,&local_b0);
    if (!bVar3) {
      pTVar1 = (this->m_tablePrinter)._M_t.
               super___uniq_ptr_impl<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>
               ._M_t.
               super__Tuple_impl<0UL,_Catch::TablePrinter_*,_std::default_delete<Catch::TablePrinter>_>
               .super__Head_base<0UL,_Catch::TablePrinter_*,_false>._M_head_impl;
      Catch::operator<<(pTVar1);
      Catch::operator<<(pTVar1);
      Catch::operator<<(pTVar1);
    }
    pTVar1 = (this->m_tablePrinter)._M_t.
             super___uniq_ptr_impl<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>.
             _M_t.
             super__Tuple_impl<0UL,_Catch::TablePrinter_*,_std::default_delete<Catch::TablePrinter>_>
             .super__Head_base<0UL,_Catch::TablePrinter_*,_false>._M_head_impl;
    std::operator<<((ostream *)&pTVar1->m_oss,(string *)&local_80);
    Catch::operator<<(pTVar1);
    std::__cxx11::string::~string((string *)&local_80);
    bVar3 = false;
    clara::TextFlow::Column::iterator::operator++(&local_b0);
  }
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e0.m_strings);
  return;
}

Assistant:

void ConsoleReporter::benchmarkStarting(BenchmarkInfo const& info) {
    lazyPrintWithoutClosingBenchmarkTable();

    auto nameCol = Column( info.name ).width( static_cast<std::size_t>( m_tablePrinter->columnInfos()[0].width - 2 ) );

    bool firstLine = true;
    for (auto line : nameCol) {
        if (!firstLine)
            (*m_tablePrinter) << ColumnBreak() << ColumnBreak() << ColumnBreak();
        else
            firstLine = false;

        (*m_tablePrinter) << line << ColumnBreak();
    }
}